

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O1

int __thiscall MXNetNode::attr_i(MXNetNode *this,char *key)

{
  int iVar1;
  int iVar2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  int i;
  allocator local_41;
  key_type local_40;
  
  std::__cxx11::string::string((string *)&local_40,key,&local_41);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->attrs)._M_t,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(int)local_40._M_dataplus._M_p) !=
      &local_40.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_40._M_dataplus._M_p._4_4_,(int)local_40._M_dataplus._M_p));
  }
  iVar2 = 0;
  if ((_Rb_tree_header *)cVar3._M_node != &(this->attrs)._M_t._M_impl.super__Rb_tree_header) {
    p_Var4 = cVar3._M_node + 2;
    iVar1 = std::__cxx11::string::compare((char *)p_Var4);
    iVar2 = 0;
    if (iVar1 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)p_Var4);
      if (iVar2 == 0) {
        iVar2 = 1;
      }
      else {
        local_40._M_dataplus._M_p._0_4_ = 0;
        iVar1 = __isoc99_sscanf(*(undefined8 *)p_Var4,"%d");
        iVar2 = 0;
        if (iVar1 == 1) {
          iVar2 = (int)local_40._M_dataplus._M_p;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int MXNetNode::attr_i(const char* key) const
{
    const std::map<std::string, std::string>::const_iterator it = attrs.find(key);
    if (it == attrs.end())
        return 0;

    if (it->second == "False")
        return 0;

    if (it->second == "True")
        return 1;

    int i = 0;
    int nscan = sscanf(it->second.c_str(), "%d", &i);
    if (nscan != 1)
        return 0;

    return i;
}